

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

string * __thiscall pbrt::Frame::ToString_abi_cxx11_(string *__return_storage_ptr__,Frame *this)

{
  Vector3<float> *in_R9;
  
  StringPrintf<pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&>
            (__return_storage_ptr__,(pbrt *)"[ Frame x: %s y: %s z: %s ]",(char *)this,&this->y,
             &this->z,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ Frame x: %s y: %s z: %s ]", x, y, z);
    }